

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
PerBlockConnectTrace::PerBlockConnectTrace(PerBlockConnectTrace *this,PerBlockConnectTrace *param_2)

{
  long lVar1;
  shared_ptr<const_CBlock> *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = (in_RSI->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::shared_ptr<const_CBlock>::shared_ptr(in_RSI,(shared_ptr<const_CBlock> *)0x14dc1cf);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PerBlockConnectTrace() = default;